

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O1

void Diligent::ValidatePipelineResourceCompatibility
               (PipelineResourceDesc *ResDesc,SHADER_RESOURCE_TYPE Type,
               PIPELINE_RESOURCE_FLAGS ResourceFlags,Uint32 ArraySize,char *ShaderName,
               char *SignatureName)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  char *pcVar2;
  char *SignatureName_local;
  char *ShaderName_local;
  Uint32 ArraySize_local;
  char *local_58;
  string msg;
  
  SignatureName_local = SignatureName;
  ShaderName_local = ShaderName;
  ArraySize_local = ArraySize;
  if (ResDesc->ResourceType != Type) {
    msg._M_dataplus._M_p = GetShaderResourceTypeLiteralName(Type,false);
    local_58 = GetShaderResourceTypeLiteralName(ResDesc->ResourceType,false);
    LogError<true,char[9],char_const*,char[32],char_const*,char[13],char_const*,char[37],char_const*,char[45],char_const*,char[3]>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x34e,(char (*) [9])"Shader \'",&ShaderName_local,
               (char (*) [32])"\' contains resource with name \'",&ResDesc->Name,
               (char (*) [13])"\' and type \'",(char **)&msg,
               (char (*) [37])"\' that is not compatible with type \'",&local_58,
               (char (*) [45])"\' specified in pipeline resource signature \'",&SignatureName_local,
               (char (*) [3])"\'.");
  }
  PVar1 = ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER;
  if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != PVar1) {
    local_58 = "";
    msg._M_dataplus._M_p = "";
    if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == PIPELINE_RESOURCE_FLAG_NONE) {
      msg._M_dataplus._M_p = " not";
    }
    if (PVar1 == PIPELINE_RESOURCE_FLAG_NONE) {
      local_58 = " not";
    }
    LogError<true,char[9],char_const*,char[22],char_const*,char[10],char_const*,char[101],char_const*,char[5],char_const*,char[18]>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x357,(char (*) [9])"Shader \'",&ShaderName_local,
               (char (*) [22])"\' contains resource \'",&ResDesc->Name,(char (*) [10])"\' that is",
               (char **)&msg,
               (char (*) [101])
               " labeled as formatted buffer, while the same resource specified by the pipeline resource signature \'"
               ,&SignatureName_local,(char (*) [5])"\' is",&local_58,
               (char (*) [18])" labeled as such.");
  }
  PVar1 = ResDesc->Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;
  if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) != PVar1) {
    pcVar2 = "combined image sampler";
    if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) == PIPELINE_RESOURCE_FLAG_NONE) {
      pcVar2 = "separate image";
    }
    local_58 = "combined image sampler.";
    if (PVar1 == PIPELINE_RESOURCE_FLAG_NONE) {
      local_58 = "separate image.";
    }
    msg._M_dataplus._M_p = pcVar2;
    LogError<true,char[9],char_const*,char[12],char_const*,char[3],char_const*,char[75],char_const*,char[6],char_const*>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x35f,(char (*) [9])"Shader \'",&ShaderName_local,(char (*) [12])"\' contains ",
               (char **)&msg,(char (*) [3])0x6b7dd2,&ResDesc->Name,
               (char (*) [75])
               "\', while the same resource is defined by the pipeline resource signature \'",
               &SignatureName_local,(char (*) [6])"\' as ",&local_58);
  }
  if (ResDesc->ArraySize == 0) {
    FormatString<char[108]>
              (&msg,(char (*) [108])
                    "ResDesc.ArraySize can\'t be zero. This error should\'ve be caught by ValidatePipelineResourceSignatureDesc()."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x362);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (ArraySize_local == 0) {
    if ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) == PIPELINE_RESOURCE_FLAG_NONE) {
      LogError<true,char[9],char_const*,char[22],char_const*,char[65],char_const*,char[81]>
                (false,"ValidatePipelineResourceCompatibility",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x36c,(char (*) [9])"Shader \'",&ShaderName_local,
                 (char (*) [22])"\' contains resource \'",&ResDesc->Name,
                 (char (*) [65])"\' that is a runtime-sized array, but in the resource signature \'"
                 ,&SignatureName_local,
                 (char (*) [81])
                 "\' the resource is defined without the PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY flag."
                );
    }
  }
  else if (ResDesc->ArraySize < ArraySize_local) {
    LogError<true,char[9],char_const*,char[22],char_const*,char[21],unsigned_int,char[35],unsigned_int,char[49],char_const*,char[3]>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x375,(char (*) [9])"Shader \'",&ShaderName_local,
               (char (*) [22])"\' contains resource \'",&ResDesc->Name,
               (char (*) [21])"\' whose array size (",&ArraySize_local,
               (char (*) [35])") is greater than the array size (",&ResDesc->ArraySize,
               (char (*) [49])") specified by the pipeline resource signature \'",
               &SignatureName_local,(char (*) [3])"\'.");
  }
  return;
}

Assistant:

void ValidatePipelineResourceCompatibility(const PipelineResourceDesc& ResDesc,
                                           SHADER_RESOURCE_TYPE        Type,
                                           PIPELINE_RESOURCE_FLAGS     ResourceFlags,
                                           Uint32                      ArraySize,
                                           const char*                 ShaderName,
                                           const char*                 SignatureName) noexcept(false)
{
    if (Type != ResDesc.ResourceType)
    {
        LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource with name '", ResDesc.Name,
                            "' and type '", GetShaderResourceTypeLiteralName(Type), "' that is not compatible with type '",
                            GetShaderResourceTypeLiteralName(ResDesc.ResourceType), "' specified in pipeline resource signature '", SignatureName, "'.");
    }

    if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER))
    {
        LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", ResDesc.Name,
                            "' that is", ((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) ? "" : " not"),
                            " labeled as formatted buffer, while the same resource specified by the pipeline resource signature '",
                            SignatureName, "' is", ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) ? "" : " not"),
                            " labeled as such.");
    }

    if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) != (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER))
    {
        LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains ",
                            ((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) ? "combined image sampler" : "separate image"),
                            " '", ResDesc.Name, "', while the same resource is defined by the pipeline resource signature '",
                            SignatureName, "' as ", ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) ? "combined image sampler." : "separate image."));
    }

    VERIFY(ResDesc.ArraySize > 0, "ResDesc.ArraySize can't be zero. This error should've be caught by ValidatePipelineResourceSignatureDesc().");

    if (ArraySize == 0)
    {
        // ArraySize == 0 means that the resource is a runtime-sized array and ResDesc.ArraySize from the
        // resource signature may have any non-zero value.
        if ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) == 0)
        {
            LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", ResDesc.Name,
                                "' that is a runtime-sized array, but in the resource signature '", SignatureName,
                                "' the resource is defined without the PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY flag.");
        }
    }
    else
    {
        if (ResDesc.ArraySize < ArraySize)
        {
            LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", ResDesc.Name,
                                "' whose array size (", ArraySize, ") is greater than the array size (",
                                ResDesc.ArraySize, ") specified by the pipeline resource signature '", SignatureName, "'.");
        }

        //if (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY)
        //{
        //    LOG_WARNING_MESSAGE("Shader '", ShaderName, "' contains resource with name '", ResDesc.Name,
        //                        "' that is defined in resource signature '", SignatureName,
        //                        "' with flag PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY, but the resource is not a runtime-sized array.");
        //}
    }
}